

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

DatabaseSnapshot * __thiscall Database::snapshot(Database *this)

{
  bool bVar1;
  reference ppOVar2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_RSI;
  DatabaseSnapshot *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_TaskSpec>,_false,_false>,_bool>
  pVar3;
  type *v;
  type *k;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
  *__range1_1;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  taskspecs;
  OnDiskDataset *d;
  iterator __end1;
  iterator __begin1;
  vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *__range1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> cds;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  *in_stack_fffffffffffffde8;
  TaskSpec *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  _Node_iterator_base<std::pair<const_unsigned_long,_TaskSpec>,_false> in_stack_fffffffffffffe00;
  DatabaseSnapshot *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *in_stack_fffffffffffffe20;
  DatabaseConfig *in_stack_fffffffffffffe28;
  path *in_stack_fffffffffffffe30;
  path *in_stack_fffffffffffffe38;
  DatabaseSnapshot *in_stack_fffffffffffffe40;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  *in_stack_fffffffffffffe50;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
  local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
  local_a0;
  pointer *local_98;
  OnDiskDataset *local_48;
  OnDiskDataset **local_40;
  __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
  local_38;
  pointer *local_30;
  
  this_00 = in_RDI;
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x136e7e);
  local_30 = &in_RSI[7].
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_38._M_current =
       (OnDiskDataset **)
       std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::begin
                 ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)
                  in_stack_fffffffffffffde8);
  local_40 = (OnDiskDataset **)
             std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::end
                       ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)
                        in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffdf0,
                       (__normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppOVar2;
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               in_stack_fffffffffffffe00._M_cur,
               (value_type *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    __gnu_cxx::
    __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
    ::operator++(&local_38);
  }
  std::
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  ::unordered_map((unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                   *)0x136f3c);
  local_98 = &in_RSI[10].
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
       ::begin((unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
                *)in_stack_fffffffffffffde8);
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
       ::end((unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
              *)in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_a0,&local_a8);
    if (!bVar1) break;
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
    ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
                 *)0x136fa4);
    in_stack_fffffffffffffdf0 =
         (TaskSpec *)
         std::get<0ul,unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
                   ((pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>
                     *)0x136fb9);
    std::get<1ul,unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
              ((pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>
                *)0x136fce);
    std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>::get
              ((unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_> *)in_stack_fffffffffffffdf0);
    pVar3 = std::
            unordered_map<unsigned_long,TaskSpec,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>>
            ::emplace<unsigned_long_const&,TaskSpec&>
                      ((unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                        *)in_stack_fffffffffffffe00._M_cur,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                       in_stack_fffffffffffffdf0);
    in_stack_fffffffffffffe00._M_cur =
         (__node_type *)
         pVar3.first.super__Node_iterator_base<std::pair<const_unsigned_long,_TaskSpec>,_false>.
         _M_cur;
    in_stack_fffffffffffffdff = pVar3.second;
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
                  *)in_stack_fffffffffffffdf0);
  }
  std::experimental::filesystem::v1::__cxx11::path::path(&this_00->db_name,&in_RDI->db_name);
  std::experimental::filesystem::v1::__cxx11::path::path(&this_00->db_name,&in_RDI->db_name);
  DatabaseConfig::DatabaseConfig
            ((DatabaseConfig *)in_stack_fffffffffffffdf0,(DatabaseConfig *)in_stack_fffffffffffffde8
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
         *)in_stack_fffffffffffffdf0,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
         *)in_stack_fffffffffffffde8);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             in_stack_fffffffffffffe40,
             (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             in_stack_fffffffffffffe38);
  std::
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  ::unordered_map((unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                   *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  DatabaseSnapshot::DatabaseSnapshot
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_RSI,in_stack_fffffffffffffe50);
  std::
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                    *)0x137120);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             in_stack_fffffffffffffe00._M_cur);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          *)0x137137);
  DatabaseConfig::~DatabaseConfig((DatabaseConfig *)0x137144);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)in_stack_fffffffffffffdf0);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)in_stack_fffffffffffffdf0);
  std::
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                    *)0x13716b);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             in_stack_fffffffffffffe00._M_cur);
  return this_00;
}

Assistant:

DatabaseSnapshot Database::snapshot() {
    std::vector<const OnDiskDataset *> cds;
    for (const auto *d : working_datasets) {
        cds.push_back(d);
    }

    std::unordered_map<uint64_t, TaskSpec> taskspecs;
    for (const auto &[k, v] : tasks) {
        taskspecs.emplace(k, *v.get());
    }

    return DatabaseSnapshot(db_name, db_base, config_, iterators, cds,
                            taskspecs);
}